

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

MacroArgumentDefaultSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::MacroArgumentDefaultSyntax,slang::parsing::Token&,std::span<slang::parsing::Token,18446744073709551615ul>>
          (BumpAllocator *this,Token *args,
          span<slang::parsing::Token,_18446744073709551615UL> *args_1)

{
  span<slang::parsing::Token,_18446744073709551615UL> elements;
  Token equals;
  MacroArgumentDefaultSyntax *tokens;
  undefined8 *in_RDX;
  MacroArgumentDefaultSyntax *this_00;
  size_t in_stack_ffffffffffffff98;
  pointer pTVar1;
  __extent_storage<18446744073709551615UL> in_stack_ffffffffffffffa0;
  BumpAllocator *in_stack_ffffffffffffffa8;
  
  tokens = (MacroArgumentDefaultSyntax *)
           allocate(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0._M_extent_value,
                    in_stack_ffffffffffffff98);
  this_00 = (MacroArgumentDefaultSyntax *)*in_RDX;
  pTVar1 = (pointer)in_RDX[1];
  elements._M_extent._M_extent_value = in_stack_ffffffffffffffa0._M_extent_value;
  elements._M_ptr = pTVar1;
  slang::syntax::TokenList::TokenList((TokenList *)this_00,elements);
  equals.info = (Info *)in_stack_ffffffffffffffa0._M_extent_value;
  equals._0_8_ = pTVar1;
  slang::syntax::MacroArgumentDefaultSyntax::MacroArgumentDefaultSyntax
            (this_00,equals,(TokenList *)tokens);
  return tokens;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }